

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-curse.c
# Opt level: O1

_Bool textui_get_curse(int *choice,object *obj,char *dice_string)

{
  _Bool _Var1;
  menu *menu;
  void *p;
  size_t sVar2;
  char *src;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  wchar_t wVar6;
  uint uVar7;
  long lVar8;
  menu_iter menu_f;
  char header [80];
  menu_iter local_b8;
  char local_88 [88];
  
  local_b8.resize = (_func_void_menu_ptr *)0x0;
  local_b8.display_row = get_curse_display;
  local_b8.row_handler = get_curse_action;
  local_b8.get_tag = (_func_char_menu_ptr_int *)0x0;
  local_b8.valid_row = (_func_int_menu_ptr_int *)0x0;
  menu = menu_new(MN_SKIN_SCROLL,&local_b8);
  p = mem_zalloc((ulong)z_info->curse_max << 3);
  iVar5 = 0;
  uVar7 = 0;
  if (1 < z_info->curse_max) {
    uVar7 = 0;
    uVar4 = 1;
    lVar8 = 8;
    iVar5 = 0;
    do {
      if ((uint)(obj->known->curses[uVar4].power + L'\xffffffff') < 99) {
        _Var1 = player_knows_curse(player,(wchar_t)uVar4);
        if (_Var1) {
          *(wchar_t *)((long)p + (long)iVar5 * 8) = (wchar_t)uVar4;
          *(wchar_t *)((long)p + (long)iVar5 * 8 + 4) = obj->curses[uVar4].power;
          sVar2 = strlen(*(char **)(curses->conflict_flags + lVar8 * 8 + -0x28));
          uVar3 = (uint)(sVar2 + 0xd);
          if (sVar2 + 0xd <= (ulong)uVar7) {
            uVar3 = uVar7;
          }
          uVar7 = uVar3;
          iVar5 = iVar5 + 1;
        }
      }
      uVar4 = uVar4 + 1;
      lVar8 = lVar8 + 7;
    } while (uVar4 < z_info->curse_max);
  }
  if (iVar5 == 0) {
    mem_free(p);
    wVar6 = L'\0';
  }
  else {
    menu_setpriv(menu,iVar5,p);
    src = format(" Remove which curse (spell strength %s)?",dice_string);
    my_strcpy(local_88,src,0x50);
    menu->header = local_88;
    menu->selections = "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
    menu->flags = 4;
    menu->browse_hook = curse_menu_browser;
    selection = L'\0';
    iVar5 = menu->count;
    DAT_002d824c = iVar5 + 2;
    _DAT_002d8244 = 1;
    uVar3 = ~uVar7 + Term->wid;
    curse_menu_area = uVar3 >> 1;
    if (uVar3 < 8) {
      curse_menu_area = 0;
    }
    sVar2 = strlen(menu->header);
    _DAT_002d8248 = (uint)sVar2;
    if (sVar2 <= uVar7 + 1) {
      _DAT_002d8248 = uVar7 + 1;
    }
    if (-2 < iVar5) {
      wVar6 = L'\x01';
      do {
        uVar7 = curse_menu_area;
        if ((int)curse_menu_area < 2) {
          uVar7 = 1;
        }
        prt("",wVar6,uVar7 + L'\xffffffff');
        wVar6 = wVar6 + L'\x01';
      } while (wVar6 < DAT_002d824c + _DAT_002d8244);
    }
    menu_layout(menu,(region *)&curse_menu_area);
    menu_select(menu,0,true);
    mem_free(p);
    mem_free(menu);
    wVar6 = selection;
  }
  if (wVar6 != L'\0') {
    *choice = wVar6;
  }
  return wVar6 != L'\0';
}

Assistant:

bool textui_get_curse(int *choice, struct object *obj, char *dice_string)
{
	int curse = curse_menu(obj, dice_string);
	if (curse) {
		*choice = curse;
		return true;
	}
	return false;
}